

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entenc.c
# Opt level: O3

void od_ec_enc_normalize(od_ec_enc *enc,od_ec_enc_window low,uint rng)

{
  uchar *puVar1;
  short sVar2;
  uint uVar3;
  uchar *__ptr;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  
  if (enc->error != 0) {
    return;
  }
  sVar2 = enc->cnt;
  uVar3 = 0x1f;
  if (rng != 0) {
    for (; rng >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  uVar9 = ~uVar3 + (int)sVar2 + 0x10;
  iVar11 = ~uVar3 + 0x10;
  if (0x27 < (int)uVar9) {
    __ptr = enc->buf;
    uVar3 = enc->offs;
    if (enc->storage < uVar3 + 8) {
      uVar6 = enc->storage * 2 + 8;
      __ptr = (uchar *)realloc(__ptr,(ulong)uVar6);
      if (__ptr == (uchar *)0x0) {
        enc->error = -1;
        return;
      }
      enc->buf = __ptr;
      enc->storage = uVar6;
    }
    uVar6 = (uVar9 >> 3) + 1 & 0xff;
    iVar10 = (int)sVar2 + uVar6 * -8;
    bVar5 = (char)iVar10 + 0x18;
    uVar7 = low >> (bVar5 & 0x3f);
    bVar4 = (byte)(uVar6 * 8);
    uVar8 = (1L << (bVar4 & 0x3f)) - 1U & uVar7;
    *(ulong *)(__ptr + uVar3) =
         (uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
          (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
          (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38) >> (-bVar4 & 0x3f);
    uVar9 = uVar3;
    if ((uVar7 >> ((ulong)(uVar6 * 8) & 0x3f) & 1) != 0) {
      do {
        puVar1 = __ptr + (uVar9 - 1);
        *puVar1 = *puVar1 + '\x01';
        uVar9 = uVar9 - 1;
      } while (*puVar1 == '\0');
    }
    low = low & ~(-1L << (bVar5 & 0x3f));
    enc->offs = uVar3 + uVar6;
    uVar9 = iVar10 + iVar11;
  }
  bVar5 = (byte)iVar11;
  enc->low = low << (bVar5 & 0x3f);
  enc->rng = (uint16_t)(rng << (bVar5 & 0x1f));
  enc->cnt = (int16_t)uVar9;
  return;
}

Assistant:

static void od_ec_enc_normalize(od_ec_enc *enc, od_ec_enc_window low,
                                unsigned rng) {
  int d;
  int c;
  int s;
  if (enc->error) return;
  c = enc->cnt;
  assert(rng <= 65535U);
  /*The number of leading zeros in the 16-bit binary representation of rng.*/
  d = 16 - OD_ILOG_NZ(rng);
  s = c + d;

  /* We flush every time "low" cannot safely and efficiently accommodate any
     more data. Overall, c must not exceed 63 at the time of byte flush out. To
     facilitate this, "s" cannot exceed 56-bits because we have to keep 1 byte
     for carry. Also, we need to subtract 16 because we want to keep room for
     the next symbol worth "d"-bits (max 15). An alternate condition would be if
     (e < d), where e = number of leading zeros in "low", indicating there is
     not enough rooom to accommodate "rng" worth of "d"-bits in "low". However,
     this approach needs additional computations: (i) compute "e", (ii) push
     the leading 0x00's as a special case.
  */
  if (s >= 40) {  // 56 - 16
    unsigned char *out = enc->buf;
    uint32_t storage = enc->storage;
    uint32_t offs = enc->offs;
    if (offs + 8 > storage) {
      storage = 2 * storage + 8;
      out = (unsigned char *)realloc(out, sizeof(*out) * storage);
      if (out == NULL) {
        enc->error = -1;
        return;
      }
      enc->buf = out;
      enc->storage = storage;
    }
    // Need to add 1 byte here since enc->cnt always counts 1 byte less
    // (enc->cnt = -9) to ensure correct operation
    uint8_t num_bytes_ready = (s >> 3) + 1;

    // Update "c" to contain the number of non-ready bits in "low". Since "low"
    // has 64-bit capacity, we need to add the (64 - 40) cushion bits and take
    // off the number of ready bits.
    c += 24 - (num_bytes_ready << 3);

    // Prepare "output" and update "low"
    uint64_t output = low >> c;
    low = low & (((uint64_t)1 << c) - 1);

    // Prepare data and carry mask
    uint64_t mask = (uint64_t)1 << (num_bytes_ready << 3);
    uint64_t carry = output & mask;

    mask = mask - 0x01;
    output = output & mask;

    // Write data in a single operation
    write_enc_data_to_out_buf(out, offs, output, carry, &enc->offs,
                              num_bytes_ready);

    // Update state of the encoder: enc->cnt to contain the number of residual
    // bits
    s = c + d - 24;
  }
  enc->low = low << d;
  enc->rng = rng << d;
  enc->cnt = s;
}